

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

span<const_slang::ast::Expression_*const,_18446744073709551615UL>
slang::ast::bindMatchItems
          (SequenceMatchListSyntax *syntax,ASTContext *context,AssertionExpr *sequence)

{
  ExpressionKind EVar1;
  Expression *this;
  Scope *pSVar2;
  bool bVar3;
  int iVar4;
  PropertyExprSyntax *initialExpr;
  ExpressionSyntax *pEVar5;
  undefined4 extraout_var;
  Symbol *pSVar6;
  Diagnostic *this_00;
  undefined4 extraout_var_00;
  AssertionExpr *this_01;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_02;
  size_type sVar7;
  ulong uVar8;
  DiagCode code;
  size_t sVar9;
  pointer ppEVar10;
  SourceRange SVar11;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar12;
  ASTContext ctx;
  SmallVector<const_slang::ast::Expression_*,_5UL> results;
  CallExpression *local_b0;
  sockaddr local_a8;
  ulong local_98;
  Symbol *pSStack_90;
  TempVarSymbol *local_88;
  RandomizeDetails *pRStack_80;
  AssertionInstanceDetails *local_78;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  CallExpression *call;
  
  local_a8._0_8_ = (context->scope).ptr;
  local_a8.sa_data._6_8_ = *(undefined8 *)&context->lookupIndex;
  uVar8 = (context->flags).m_bits;
  pSStack_90 = context->instanceOrProc;
  local_88 = context->firstTempVar;
  pRStack_80 = context->randomizeDetails;
  local_78 = context->assertionInstance;
  local_98 = uVar8 & 0xfffffffbf;
  if (((uint)uVar8 >> 0x14 & 1) == 0) {
    local_70[0].data_ = (pointer)local_70[0].firstElement;
    local_70[0].len = 0;
    local_70[0].cap = 5;
    uVar8 = (syntax->items).elements.size_ + 1;
    if (1 < uVar8) {
      sVar9 = 0;
      do {
        initialExpr = slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::
                      operator[](&syntax->items,sVar9);
        pEVar5 = ASTContext::requireSimpleExpr(context,initialExpr,(DiagCode)0x200008);
        if (pEVar5 != (ExpressionSyntax *)0x0) {
          iVar4 = Expression::bind((int)pEVar5,&local_a8,0x20);
          call = (CallExpression *)CONCAT44(extraout_var,iVar4);
          local_b0 = call;
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,
                     (Expression **)&local_b0);
          EVar1 = (call->super_Expression).kind;
          if ((int)EVar1 < 0xe) {
            if (EVar1 != Invalid) {
              if (EVar1 == UnaryOp) {
                code.subsystem = Statements;
                code.code = 0x20;
                if (*(int *)&(call->subroutine).
                             super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             .
                             super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             ._M_u - 10U < 4) {
                  call = *(CallExpression **)
                          ((long)&(call->subroutine).
                                  super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          + 8);
                  pSVar6 = Expression::getSymbolReference(&call->super_Expression,true);
                  code.subsystem = Statements;
                  code.code = 0x24;
                  if ((pSVar6 != (Symbol *)0x0) && (pSVar6->kind == LocalAssertionVar))
                  goto LAB_0039e593;
                }
                ASTContext::addDiag(context,code,(call->super_Expression).sourceRange);
              }
              else {
LAB_0039e54c:
                ASTContext::addDiag(context,(DiagCode)0x200008,(call->super_Expression).sourceRange)
                ;
              }
            }
          }
          else if (EVar1 == Assignment) {
            this = *(Expression **)
                    ((long)&(call->subroutine).
                            super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            .
                            super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                    + 0x10);
            pSVar6 = Expression::getSymbolReference(this,true);
            if ((pSVar6 == (Symbol *)0x0) || (pSVar6->kind != LocalAssertionVar)) {
              ASTContext::addDiag(context,(DiagCode)0x240008,this->sourceRange);
            }
          }
          else {
            if (EVar1 != Call) goto LAB_0039e54c;
            AssertionExpr::checkAssertionCall
                      (call,context,(DiagCode)0x430008,(DiagCode)0x420008,
                       (optional<slang::DiagCode>)0x0,(call->super_Expression).sourceRange);
          }
        }
LAB_0039e593:
        sVar9 = sVar9 + 1;
      } while (uVar8 >> 1 != sVar9);
    }
    bVar3 = AssertionExpr::admitsEmpty(sequence);
    src = extraout_RDX;
    if (bVar3) {
      SVar11 = slang::syntax::SyntaxNode::sourceRange
                         (&(syntax->items).super_SyntaxListBase.super_SyntaxNode);
      this_00 = ASTContext::addDiag(context,(DiagCode)0x260008,SVar11);
      src = extraout_RDX_00;
      if (sequence->syntax != (SyntaxNode *)0x0) {
        SVar11 = slang::syntax::SyntaxNode::sourceRange(sequence->syntax);
        Diagnostic::operator<<(this_00,SVar11);
        src = extraout_RDX_01;
      }
    }
    pSVar2 = (context->scope).ptr;
    if (pSVar2 == (Scope *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                );
    }
    iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_70,(EVP_PKEY_CTX *)pSVar2->compilation,src);
    ppEVar10 = (pointer)CONCAT44(extraout_var_00,iVar4);
    sVar7 = extraout_RDX_02;
    if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
      free(local_70[0].data_);
    }
  }
  else {
    uVar8 = (syntax->items).elements.size_ + 1;
    sVar7 = 0;
    ppEVar10 = (pointer)0x0;
    if (1 < uVar8) {
      sVar7 = 0;
      sVar9 = 0;
      do {
        this_01 = (AssertionExpr *)
                  slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::operator[]
                            (&syntax->items,sVar9);
        AssertionExpr::bind(this_01,(int)&local_a8,(sockaddr *)0x0,0);
        sVar9 = sVar9 + 1;
      } while (uVar8 >> 1 != sVar9);
      ppEVar10 = (pointer)0x0;
    }
  }
  sVar12.size_ = sVar7;
  sVar12.data_ = ppEVar10;
  return sVar12;
}

Assistant:

static span<const Expression* const> bindMatchItems(const SequenceMatchListSyntax& syntax,
                                                    const ASTContext& context,
                                                    const AssertionExpr& sequence) {
    auto checkLocalVar = [&](const Expression& expr) {
        auto sym = expr.getSymbolReference();
        if (!sym || sym->kind != SymbolKind::LocalAssertionVar)
            context.addDiag(diag::LocalVarMatchItem, expr.sourceRange);
    };

    ASTContext ctx = context;
    ctx.flags &= ~ASTFlags::AssignmentDisallowed;

    // If we are creating an argument, these "match items" might actually be part of
    // a comma-separated event expression. We need to avoid erroring in that case.
    // Just do the bare minimum to check the expressions here.
    if (ctx.flags.has(ASTFlags::AssertionInstanceArgCheck)) {
        for (auto item : syntax.items)
            AssertionExpr::bind(*item, ctx);
        return {};
    }

    SmallVector<const Expression*> results;
    for (auto item : syntax.items) {
        auto exprSyn = context.requireSimpleExpr(*item, diag::InvalidMatchItem);
        if (!exprSyn)
            continue;

        auto& expr = Expression::bind(*exprSyn, ctx, ASTFlags::AssignmentAllowed);
        results.push_back(&expr);

        switch (expr.kind) {
            case ExpressionKind::Assignment: {
                auto& assign = expr.as<AssignmentExpression>();
                checkLocalVar(assign.left());
                break;
            }
            case ExpressionKind::UnaryOp: {
                auto& unary = expr.as<UnaryExpression>();
                switch (unary.op) {
                    case UnaryOperator::Preincrement:
                    case UnaryOperator::Predecrement:
                    case UnaryOperator::Postincrement:
                    case UnaryOperator::Postdecrement:
                        checkLocalVar(unary.operand());
                        break;
                    default:
                        context.addDiag(diag::InvalidMatchItem, expr.sourceRange);
                        break;
                }
                break;
            }
            case ExpressionKind::Call: {
                AssertionExpr::checkAssertionCall(expr.as<CallExpression>(), context,
                                                  diag::SubroutineMatchOutArg,
                                                  diag::SubroutineMatchAutoRefArg, std::nullopt,
                                                  expr.sourceRange);
                break;
            }
            case ExpressionKind::Invalid:
                break;
            default:
                context.addDiag(diag::InvalidMatchItem, expr.sourceRange);
                break;
        }
    }

    if (sequence.admitsEmpty()) {
        auto& diag = context.addDiag(diag::MatchItemsAdmitEmpty, syntax.items.sourceRange());
        if (sequence.syntax)
            diag << sequence.syntax->sourceRange();
    }

    return results.copy(context.getCompilation());
}